

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void kwsysProcessesSignalHandler(int signum,siginfo_t *info,void *ucontext)

{
  cmsysProcess *pcVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int procStatus;
  char buf;
  sigset_t unblockSet;
  undefined1 local_14c [4];
  _union_1457 local_148;
  sigset_t local_140;
  sigset_t local_b0;
  
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  if (signum == 0x11) {
    if (0 < kwsysProcesses.Count) {
      lVar6 = 0;
      do {
        local_148._0_1_ = 1;
        pcVar1 = kwsysProcesses.Processes[lVar6];
        read(pcVar1->PipeReadEnds[2],&local_148,1);
        write(pcVar1->SignalPipe,&local_148,1);
        lVar6 = lVar6 + 1;
      } while (lVar6 < kwsysProcesses.Count);
    }
  }
  else if ((signum == 2) || (signum == 0xf)) {
    if (0 < kwsysProcesses.Count) {
      lVar6 = 0;
      do {
        pcVar1 = kwsysProcesses.Processes[lVar6];
        if ((((pcVar1->CreateProcessGroup != 0) && (pcVar1->Killed == 0)) && (pcVar1->State != 1))
           && ((pcVar1->ForkPIDs != (pid_t *)0x0 && (0 < pcVar1->NumberOfCommands)))) {
          lVar5 = 0;
          do {
            if (pcVar1->ForkPIDs[lVar5] != 0) {
              kill(-pcVar1->ForkPIDs[lVar5],2);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < pcVar1->NumberOfCommands);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < kwsysProcesses.Count);
    }
    do {
      do {
        _Var2 = wait(local_14c);
      } while (-1 < _Var2);
    } while (*piVar4 != 10);
    memset(&local_148,0,0x98);
    sigemptyset(&local_140);
    do {
      iVar3 = sigaction(signum,(sigaction *)&local_148,(sigaction *)0x0);
      if (-1 < iVar3) break;
    } while (*piVar4 == 4);
    sigemptyset(&local_b0);
    sigaddset(&local_b0,signum);
    sigprocmask(1,&local_b0,(sigset_t *)0x0);
    raise(signum);
    _exit(1);
  }
  *piVar4 = iVar3;
  return;
}

Assistant:

static void kwsysProcessesSignalHandler(int signum
#if KWSYSPE_USE_SIGINFO
                                        ,
                                        siginfo_t* info, void* ucontext
#endif
)
{
  int i, j, procStatus, old_errno = errno;
#if KWSYSPE_USE_SIGINFO
  (void)info;
  (void)ucontext;
#endif

  /* Signal all process objects that a child has terminated.  */
  switch (signum) {
    case SIGCHLD:
      for (i = 0; i < kwsysProcesses.Count; ++i) {
        /* Set the pipe in a signalled state.  */
        char buf = 1;
        kwsysProcess* cp = kwsysProcesses.Processes[i];
        kwsysProcess_ssize_t pipeStatus =
          read(cp->PipeReadEnds[KWSYSPE_PIPE_SIGNAL], &buf, 1);
        (void)pipeStatus;
        pipeStatus = write(cp->SignalPipe, &buf, 1);
        (void)pipeStatus;
      }
      break;
    case SIGINT:
    case SIGTERM:
      /* Signal child processes that are running in new process groups.  */
      for (i = 0; i < kwsysProcesses.Count; ++i) {
        kwsysProcess* cp = kwsysProcesses.Processes[i];
        /* Check Killed to avoid data race condition when killing.
           Check State to avoid data race condition in kwsysProcessCleanup
           when there is an error (it leaves a reaped PID).  */
        if (cp->CreateProcessGroup && !cp->Killed &&
            cp->State != kwsysProcess_State_Error && cp->ForkPIDs) {
          for (j = 0; j < cp->NumberOfCommands; ++j) {
            /* Make sure the PID is still valid. */
            if (cp->ForkPIDs[j]) {
              /* The user created a process group for this process.  The group
                 ID
                 is the process ID for the original process in the group.  */
              kill(-cp->ForkPIDs[j], SIGINT);
            }
          }
        }
      }

      /* Wait for all processes to terminate.  */
      while (wait(&procStatus) >= 0 || errno != ECHILD) {
      }

      /* Terminate the process, which is now in an inconsistent state
         because we reaped all the PIDs that it may have been reaping
         or may have reaped in the future.  Reraise the signal so that
         the proper exit code is returned.  */
      {
        /* Install default signal handler.  */
        struct sigaction defSigAction;
        sigset_t unblockSet;
        memset(&defSigAction, 0, sizeof(defSigAction));
        defSigAction.sa_handler = SIG_DFL;
        sigemptyset(&defSigAction.sa_mask);
        while ((sigaction(signum, &defSigAction, 0) < 0) && (errno == EINTR))
          ;
        /* Unmask the signal.  */
        sigemptyset(&unblockSet);
        sigaddset(&unblockSet, signum);
        sigprocmask(SIG_UNBLOCK, &unblockSet, 0);
        /* Raise the signal again.  */
        raise(signum);
        /* We shouldn't get here... but if we do... */
        _exit(1);
      }
      /* break omitted to silence unreachable code clang compiler warning.  */
  }

#if !KWSYSPE_USE_SIGINFO
  /* Re-Install our handler.  Repeat call until it is not interrupted.  */
  {
    struct sigaction newSigAction;
    struct sigaction& oldSigAction;
    memset(&newSigAction, 0, sizeof(struct sigaction));
    newSigChldAction.sa_handler = kwsysProcessesSignalHandler;
    newSigChldAction.sa_flags = SA_NOCLDSTOP;
    sigemptyset(&newSigAction.sa_mask);
    switch (signum) {
      case SIGCHLD:
        oldSigAction = &kwsysProcessesOldSigChldAction;
        break;
      case SIGINT:
        sigaddset(&newSigAction.sa_mask, SIGTERM);
        oldSigAction = &kwsysProcessesOldSigIntAction;
        break;
      case SIGTERM:
        sigaddset(&newSigAction.sa_mask, SIGINT);
        oldSigAction = &kwsysProcessesOldSigTermAction;
        break;
      default:
        return 0;
    }
    while ((sigaction(signum, &newSigAction, oldSigAction) < 0) &&
           (errno == EINTR))
      ;
  }
#endif

  errno = old_errno;
}